

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::free_node(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
            *this,node *n)

{
  size_type *psVar1;
  bool bVar2;
  
  bVar2 = n->level == 0;
  operator_delete(n,(ulong)bVar2 * 8 + 0x110);
  psVar1 = &(this->m_stats).leaves + !bVar2;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

inline void free_node(node *n)
        {
            if (n->isleafnode()) {
                leaf_node *ln = static_cast<leaf_node*>(n);
                typename leaf_node::alloc_type a(leaf_node_allocator());
                a.destroy(ln);
                a.deallocate(ln, 1);
                m_stats.leaves--;
            }
            else {
                inner_node *in = static_cast<inner_node*>(n);
                typename inner_node::alloc_type a(inner_node_allocator());
                a.destroy(in);
                a.deallocate(in, 1);
                m_stats.innernodes--;
            }
        }